

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O0

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::condense_leaf(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *this,size_t N)

{
  bool bVar1;
  size_type sVar2;
  back_insert_iterator<boost::container::small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void>_>
  __result;
  reference prVar3;
  reference puVar4;
  reference v;
  undefined1 local_d0 [16];
  const_iterator e;
  vec_iterator<unsigned_long_*,_true> local_b8;
  const_iterator i;
  vec_iterator<unsigned_long_*,_true> local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  iterator found;
  undefined1 local_60 [8];
  undefined1 local_58 [16];
  temporal_vec_type eliminated_objs;
  node_type *node;
  size_t N_local;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *this_local;
  
  eliminated_objs.super_type.m_rest_of_storage[0] =
       (aligned_struct_wrapper<8UL,_8UL>  [1])
       boost::container::
       vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
       ::at(&this->tree_,N);
  if ((*(byte *)eliminated_objs.super_type.m_rest_of_storage[0] & 1) == 0) {
    __assert_fail("node.is_leaf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                  ,0x151,
                  "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_leaf(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                 );
  }
  sVar2 = boost::container::
          vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          ::size((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                  *)((long)eliminated_objs.super_type.m_rest_of_storage[0] + 0x10));
  if ((sVar2 < 2) && (*(long *)((long)eliminated_objs.super_type.m_rest_of_storage[0] + 8) != -1)) {
    boost::container::small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void>::
    small_vector((small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void> *)
                 (local_58 + 8));
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::begin((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             *)local_58);
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::end((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
           *)local_60);
    __result = std::
               back_inserter<boost::container::small_vector<unsigned_long,2ul,std::allocator<unsigned_long>,void>>
                         ((small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void> *)
                          (local_58 + 8));
    found.m_ptr = (unsigned_long *)
                  std::
                  copy<boost::container::vec_iterator<unsigned_long*,true>,std::back_insert_iterator<boost::container::small_vector<unsigned_long,2ul,std::allocator<unsigned_long>,void>>>
                            ((vec_iterator<unsigned_long_*,_true> *)local_58,
                             (vec_iterator<unsigned_long_*,_true> *)local_60,__result);
    boost::container::
    vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
    ::at(&this->tree_,*(size_type *)((long)eliminated_objs.super_type.m_rest_of_storage[0] + 8));
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::begin((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             *)local_90);
    boost::container::
    vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
    ::at(&this->tree_,*(size_type *)((long)eliminated_objs.super_type.m_rest_of_storage[0] + 8));
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::end((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
           *)(local_a0 + 8));
    std::find<boost::container::vec_iterator<unsigned_long*,false>,unsigned_long>
              ((vec_iterator<unsigned_long_*,_false> *)(local_90 + 8),
               (vec_iterator<unsigned_long_*,_false> *)local_90,(unsigned_long *)(local_a0 + 8));
    boost::container::
    vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
    ::at(&this->tree_,*(size_type *)((long)eliminated_objs.super_type.m_rest_of_storage[0] + 8));
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::end((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
           *)local_a0);
    bVar1 = boost::container::operator!=
                      ((vec_iterator<unsigned_long_*,_false> *)(local_90 + 8),
                       (vec_iterator<unsigned_long_*,_false> *)local_a0);
    if (!bVar1) {
      __assert_fail("found != this->tree_.at(node.parent).entry.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                    ,0x162,
                    "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_leaf(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                   );
    }
    prVar3 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(&this->tree_,
                  *(size_type *)((long)eliminated_objs.super_type.m_rest_of_storage[0] + 8));
    boost::container::vec_iterator<unsigned_long_*,_true>::vec_iterator
              (&local_a8,(nonconst_iterator *)(local_90 + 8));
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::erase((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             *)&i,(const_iterator *)&prVar3->entry);
    prVar3 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(&this->tree_,
                  *(size_type *)((long)eliminated_objs.super_type.m_rest_of_storage[0] + 8));
    condense_box(this,prVar3);
    boost::container::
    vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
    ::begin((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
             *)&e);
    boost::container::vec_iterator<unsigned_long_*,_true>::vec_iterator
              (&local_b8,(nonconst_iterator *)&e);
    boost::container::
    vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
    ::end((vector<unsigned_long,_boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_void>
           *)local_d0);
    boost::container::vec_iterator<unsigned_long_*,_true>::vec_iterator
              ((vec_iterator<unsigned_long_*,_true> *)(local_d0 + 8),(nonconst_iterator *)local_d0);
    while (bVar1 = boost::container::operator!=
                             (&local_b8,(vec_iterator<unsigned_long_*,_true> *)(local_d0 + 8)),
          bVar1) {
      puVar4 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*(&local_b8);
      v = boost::container::
          vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
          ::at(&this->container_,*puVar4);
      insert(this,v);
      boost::container::vec_iterator<unsigned_long_*,_true>::operator++(&local_b8);
    }
    condense_node(this,*(size_t *)((long)eliminated_objs.super_type.m_rest_of_storage[0] + 8));
    boost::container::small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void>::
    ~small_vector((small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void> *)
                  (local_58 + 8));
  }
  return;
}

Assistant:

void condense_leaf(const std::size_t N)
    {
        const node_type& node = this->tree_.at(N);
        assert(node.is_leaf);

        if(node.has_enough_entry() || node.parent == nil)
        {
            return;
        }

        // copy index of objects
        typedef typename gen_small_vector<std::size_t, min_entry>::type temporal_vec_type;
        temporal_vec_type eliminated_objs;
        std::copy(node.entry.begin(), node.entry.end(),
                  std::back_inserter(eliminated_objs));

        // erase the node N from its parent and condense aabb
        typename node_type::iterator found = std::find(
                this->tree_.at(node.parent).entry.begin(),
                this->tree_.at(node.parent).entry.end(), N);
        assert(found != this->tree_.at(node.parent).entry.end());
        this->tree_.at(node.parent).entry.erase(found);
        this->condense_box(this->tree_.at(node.parent));

        // re-insert entries eliminated from node N
        for(typename temporal_vec_type::const_iterator
                i(eliminated_objs.begin()), e(eliminated_objs.end()); i!=e; ++i)
        {
            this->insert(this->container_.at(*i));
        }

        // condense ancester nodes...
        condense_node(node.parent);
        return;
    }